

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

int Bac_ManBoxNum_rec(Bac_Ntk_t *p)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Bac_Ntk_t *p_00;
  long lVar5;
  
  iVar4 = p->Count;
  if (iVar4 < 0) {
    iVar3 = (p->vType).nSize;
    if (iVar3 < 1) {
      iVar4 = 0;
    }
    else {
      lVar5 = 0;
      iVar4 = 0;
      do {
        bVar1 = (p->vType).pArray[lVar5];
        if (0xffffffbb < (bVar1 >> 1) - 0x49) {
          iVar2 = 1;
          if ((bVar1 & 0xfe) == 10) {
            if ((p->vFanin).nSize <= lVar5) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = (p->vFanin).pArray[lVar5];
            if (((long)iVar3 < 1) || (p->pDesign->nNtks < iVar3)) {
              p_00 = (Bac_Ntk_t *)0x0;
            }
            else {
              p_00 = p->pDesign->pNtks + iVar3;
            }
            iVar2 = Bac_ManBoxNum_rec(p_00);
            iVar3 = (p->vType).nSize;
          }
          iVar4 = iVar4 + iVar2;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar3);
    }
    p->Count = iVar4;
  }
  return iVar4;
}

Assistant:

static inline int Bac_ManBoxNum_rec( Bac_Ntk_t * p )
{
    int iObj, Counter = 0;
    if ( p->Count >= 0 )
        return p->Count;
    Bac_NtkForEachBox( p, iObj )
        Counter += Bac_ObjIsBoxUser(p, iObj) ? Bac_ManBoxNum_rec( Bac_BoxNtk(p, iObj) ) : 1;
    return (p->Count = Counter);
}